

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifNeuron.cpp
# Opt level: O1

void __thiscall LifNeuron::RelaxOutput(LifNeuron *this,float time,bool withSpike)

{
  float fVar1;
  Potential PVar2;
  float fVar3;
  
  if (0.0 <= this->tOut) {
    fVar1 = this->a;
    fVar3 = expf((this->tOut - time) / this->tau);
    PVar2 = fVar3 * fVar1 + (float)withSpike;
  }
  else {
    PVar2 = (Potential)withSpike;
  }
  this->a = PVar2;
  if ((withSpike) && (this->tOut = time, this->fts <= 0.0 && this->fts != 0.0)) {
    this->fts = time;
  }
  return;
}

Assistant:

void LifNeuron::RelaxOutput( float time, bool withSpike )
{
    if ( tOut >= 0 ) {
        a = a * exp(( tOut - time ) / tau ) + withSpike;
    } else {
        a = withSpike;
    }
    if ( withSpike ) {
        tOut = time;
        if ( fts < 0 ) {
            fts = time;
        }
    }
}